

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::insertSpirvRequirement(TIntermediate *this,TSpirvRequirement *spirvReq)

{
  TSpirvRequirement *this_00;
  _Base_ptr p_Var1;
  TSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> extension;
  
  if (this->spirvRequirement == (TSpirvRequirement *)0x0) {
    this_00 = (TSpirvRequirement *)
              TSpirvRequirement::operator_new((TSpirvRequirement *)0x70,(size_t)spirvReq);
    TSpirvRequirement::TSpirvRequirement(this_00);
    this->spirvRequirement = this_00;
  }
  for (p_Var1 = (spirvReq->extensions).
                super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(spirvReq->extensions).
       super_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&extension,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (p_Var1 + 1));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
    ::
    _M_insert_unique<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&>
              ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                *)this->spirvRequirement,&extension);
  }
  for (p_Var1 = (spirvReq->capabilities).
                super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t._M_impl.
                super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(spirvReq->capabilities).super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>._M_t.
       _M_impl.super__Rb_tree_header; p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    extension._M_dataplus.super_allocator_type.allocator._0_4_ = p_Var1[1]._M_color;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,glslang::pool_allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,glslang::pool_allocator<int>> *)
               &this->spirvRequirement->capabilities,(int *)&extension);
  }
  return;
}

Assistant:

void TIntermediate::insertSpirvRequirement(const TSpirvRequirement* spirvReq)
{
    if (!spirvRequirement)
        spirvRequirement = new TSpirvRequirement;

    for (auto extension : spirvReq->extensions)
        spirvRequirement->extensions.insert(extension);

    for (auto capability : spirvReq->capabilities)
        spirvRequirement->capabilities.insert(capability);
}